

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int detectsuffix(char *str,char *suffix)

{
  char cVar1;
  uint uVar2;
  __int32_t **pp_Var3;
  ushort **ppuVar4;
  
  pp_Var3 = __ctype_toupper_loc();
  while( true ) {
    if ((*pp_Var3)[*str] != (*pp_Var3)[*suffix]) {
      uVar2 = 0;
      if (*suffix == '\0') {
        ppuVar4 = __ctype_b_loc();
        do {
          cVar1 = *str;
          str = str + 1;
        } while ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        uVar2 = (uint)(cVar1 == '\0');
      }
      return uVar2;
    }
    if (*str == '\0') break;
    str = str + 1;
    suffix = suffix + 1;
  }
  return 1;
}

Assistant:

static int detectsuffix(const char * str, const char * suffix) {
	/* scan pairwise through strings until mismatch detected */
	while ( toupper(*str) == toupper(*suffix) ) {
		/* printf("'%c' '%c'\n", *str, *suffix); */

		/* return 1 (success) if match persists until the string terminator */
		if (*str == '\0') {
			return 1;
		}

		/* next chars */
		str++;
		suffix++;
	}

	/* printf("'%c' '%c' mismatch\n", *str, *suffix); */

	/* return 0 (fail) if the matching did not consume the entire suffix */
	if (*suffix != 0) {
		return 0;    /* failed to consume entire suffix */
	}

	/* skip any remaining whitespace in str */
	while (isspace(*str)) {
		str++;
	}

	/* return 1 (success) if we have reached end of str else return 0 (fail) */
	return (*str == '\0') ? 1 : 0;
}